

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

void push_onecapture(MatchState *ms,int i,char *s,char *e)

{
  size_t len;
  ptrdiff_t l;
  char *e_local;
  char *s_local;
  int i_local;
  MatchState *ms_local;
  
  if (i < ms->level) {
    len = ms->capture[i].len;
    if (len == 0xffffffffffffffff) {
      lj_err_caller(ms->L,LJ_ERR_STRCAPU);
    }
    if (len == 0xfffffffffffffffe) {
      lua_pushinteger(ms->L,(lua_Integer)(ms->capture[i].init + (1 - (long)ms->src_init)));
    }
    else {
      lua_pushlstring(ms->L,ms->capture[i].init,len);
    }
  }
  else {
    if (i != 0) {
      lj_err_caller(ms->L,LJ_ERR_STRCAPI);
    }
    lua_pushlstring(ms->L,s,(long)e - (long)s);
  }
  return;
}

Assistant:

static void push_onecapture(MatchState *ms, int i, const char *s, const char *e)
{
  if (i >= ms->level) {
    if (i == 0)  /* ms->level == 0, too */
      lua_pushlstring(ms->L, s, (size_t)(e - s));  /* add whole match */
    else
      lj_err_caller(ms->L, LJ_ERR_STRCAPI);
  } else {
    ptrdiff_t l = ms->capture[i].len;
    if (l == CAP_UNFINISHED) lj_err_caller(ms->L, LJ_ERR_STRCAPU);
    if (l == CAP_POSITION)
      lua_pushinteger(ms->L, ms->capture[i].init - ms->src_init + 1);
    else
      lua_pushlstring(ms->L, ms->capture[i].init, (size_t)l);
  }
}